

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void StatPrint(SuperLUStat_t *stat)

{
  double dVar1;
  double *pdVar2;
  flops_t *pfVar3;
  double dVar4;
  
  pdVar2 = stat->utime;
  pfVar3 = stat->ops;
  printf("Factor time  = %8.5f\n",pdVar2[7]);
  dVar1 = pdVar2[7];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar4 = (double)pfVar3[7];
    printf("Factor flops = %e\tMflops = %8.2f\n",dVar4,(dVar4 * 1e-06) / dVar1);
  }
  printf("Solve time   = %8.4f\n",pdVar2[0x11]);
  dVar1 = pdVar2[0x11];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar4 = (double)pfVar3[0x11];
    printf("Solve flops = %e\tMflops = %8.2f\n",dVar4,(dVar4 * 1e-06) / dVar1);
  }
  printf("Number of memory expansions: %d\n",(ulong)(uint)stat->expansions);
  return;
}

Assistant:

void
StatPrint(SuperLUStat_t *stat)
{
    double         *utime;
    flops_t        *ops;

    utime = stat->utime;
    ops   = stat->ops;
    printf("Factor time  = %8.5f\n", utime[FACT]);
    if ( utime[FACT] != 0.0 )
      printf("Factor flops = %e\tMflops = %8.2f\n", ops[FACT],
	     ops[FACT]*1e-6/utime[FACT]);

    printf("Solve time   = %8.4f\n", utime[SOLVE]);
    if ( utime[SOLVE] != 0.0 )
      printf("Solve flops = %e\tMflops = %8.2f\n", ops[SOLVE],
	     ops[SOLVE]*1e-6/utime[SOLVE]);

    printf("Number of memory expansions: %d\n", stat->expansions);

}